

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjunction_filter.cpp
# Opt level: O3

unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> __thiscall
duckdb::ConjunctionOrFilter::Copy(ConjunctionOrFilter *this)

{
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *puVar1;
  ConjunctionOrFilter *this_00;
  pointer pCVar2;
  pointer pTVar3;
  long in_RSI;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *this_01;
  _Head_base<0UL,_duckdb::ConjunctionOrFilter_*,_false> local_40;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_38;
  
  this_00 = (ConjunctionOrFilter *)operator_new(0x28);
  ConjunctionOrFilter(this_00);
  this_01 = *(unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> **)
             (in_RSI + 0x10);
  puVar1 = *(unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> **)
            (in_RSI + 0x18);
  local_40._M_head_impl = this_00;
  if (this_01 != puVar1) {
    do {
      pCVar2 = unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
               ::operator->((unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                             *)&local_40);
      pTVar3 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
               operator->(this_01);
      (*pTVar3->_vptr_TableFilter[4])(&local_38,pTVar3);
      ::std::
      vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
                ((vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
                  *)&(pCVar2->super_ConjunctionFilter).child_filters,
                 (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
                 &local_38);
      if (local_38._M_head_impl != (TableFilter *)0x0) {
        (*(local_38._M_head_impl)->_vptr_TableFilter[1])();
      }
      this_01 = this_01 + 1;
    } while (this_01 != puVar1);
  }
  (this->super_ConjunctionFilter).super_TableFilter._vptr_TableFilter =
       (_func_int **)local_40._M_head_impl;
  return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)
         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)this;
}

Assistant:

unique_ptr<TableFilter> ConjunctionOrFilter::Copy() const {
	auto result = make_uniq<ConjunctionOrFilter>();
	for (auto &filter : child_filters) {
		result->child_filters.push_back(filter->Copy());
	}
	return std::move(result);
}